

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_FloodZones(void)

{
  undefined1 auVar1 [16];
  zone_t *pzVar2;
  int iVar3;
  ReverbContainer *pRVar4;
  uint zonenum;
  sector_t_conflict *psVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (numsectors < 1) {
    zonenum = 0;
  }
  else {
    lVar6 = 0;
    lVar7 = 0;
    zonenum = 0;
    psVar5 = sectors;
    iVar3 = numsectors;
    do {
      if (*(short *)((long)psVar5->Portals + lVar6 + -0x14) == -1) {
        P_FloodZone((sector_t_conflict *)((long)&psVar5->planes[0].xform.xOffs + lVar6),zonenum);
        psVar5 = sectors;
        iVar3 = numsectors;
        zonenum = zonenum + 1;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x218;
    } while (lVar7 < iVar3);
    if (Zones.Count <= zonenum && zonenum - Zones.Count != 0) {
      TArray<zone_t,_zone_t>::Grow(&Zones,zonenum - Zones.Count);
    }
  }
  Zones.Count = zonenum;
  pRVar4 = S_FindEnvironment(level.DefaultEnvironment);
  if (pRVar4 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    pRVar4 = DefaultEnvironments[0];
  }
  pzVar2 = Zones.Array;
  auVar1 = _DAT_005d6240;
  if (0 < (int)zonenum) {
    lVar6 = (ulong)zonenum - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar8 = auVar8 ^ _DAT_005d6240;
    auVar9 = _DAT_005d6230;
    do {
      auVar10 = auVar9 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        *(ReverbContainer **)((long)&pzVar2->Environment + lVar6) = pRVar4;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        *(ReverbContainer **)((long)&pzVar2[1].Environment + lVar6) = pRVar4;
      }
      lVar7 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar7 + 2;
      lVar6 = lVar6 + 0x10;
    } while ((ulong)(zonenum + 1 >> 1) << 4 != lVar6);
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	Zones.Resize(z);
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		Zones[i].Environment = reverb;
	}
}